

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

LONGLONG quick_select_longlong(LONGLONG *arr,int n)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  LONGLONG t;
  int iVar6;
  LONGLONG t_2;
  long lVar7;
  LONGLONG t_3;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  LONGLONG t_1;
  long lVar12;
  
  iVar6 = (int)(n - 1U) / 2;
  iVar10 = 0;
  uVar9 = n - 1U;
  do {
    if ((int)uVar9 <= iVar10) {
LAB_001b37e1:
      return arr[iVar6];
    }
    uVar5 = iVar10 + 1;
    uVar11 = (ulong)uVar5;
    if (uVar9 == uVar5) {
      lVar7 = arr[iVar10];
      if (arr[(int)uVar9] < lVar7) {
        arr[iVar10] = arr[(int)uVar9];
        arr[(int)uVar9] = lVar7;
      }
      goto LAB_001b37e1;
    }
    iVar3 = (int)(iVar10 + uVar9) / 2;
    lVar7 = arr[iVar3];
    lVar8 = arr[(int)uVar9];
    if (lVar8 < lVar7) {
      arr[iVar3] = lVar8;
      arr[(int)uVar9] = lVar7;
      lVar8 = lVar7;
    }
    lVar7 = arr[iVar10];
    if (lVar8 < lVar7) {
      arr[iVar10] = lVar8;
      arr[(int)uVar9] = lVar7;
      lVar7 = arr[iVar10];
    }
    lVar8 = arr[iVar3];
    if (lVar7 < lVar8) {
      arr[iVar3] = lVar7;
      arr[iVar10] = lVar8;
      lVar8 = arr[iVar3];
    }
    arr[iVar3] = arr[(int)uVar5];
    arr[(int)uVar5] = lVar8;
    uVar5 = uVar9;
    while( true ) {
      lVar7 = arr[iVar10];
      uVar11 = (ulong)(int)uVar11;
      do {
        lVar8 = arr[uVar11 + 1];
        uVar11 = uVar11 + 1;
      } while (lVar8 < lVar7);
      lVar2 = (long)(int)uVar5 + 1;
      do {
        uVar4 = uVar5;
        lVar12 = lVar2;
        lVar1 = arr[lVar12 + -2];
        uVar5 = uVar4 - 1;
        lVar2 = lVar12 + -1;
      } while (lVar7 < lVar1);
      if (lVar12 + -1 <= (long)uVar11) break;
      arr[uVar11] = lVar1;
      arr[lVar12 + -2] = lVar8;
    }
    arr[iVar10] = lVar1;
    arr[lVar12 + -2] = lVar7;
    if ((int)uVar5 <= iVar6) {
      iVar10 = (int)uVar11;
    }
    if (iVar6 < (int)uVar4) {
      uVar9 = uVar4 - 2;
    }
  } while( true );
}

Assistant:

static LONGLONG quick_select_longlong(LONGLONG arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}